

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucmndata.cpp
# Opt level: O2

DataHeader *
offsetTOCLookupFn(UDataMemory *pData,char *tocEntryName,int32_t *pLength,UErrorCode *pErrorCode)

{
  int *piVar1;
  int32_t iVar2;
  int32_t iVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int local_54;
  int32_t local_50;
  int32_t local_4c;
  long local_48;
  int *local_40;
  char *local_38;
  
  piVar1 = (int *)pData->toc;
  if (piVar1 == (int *)0x0) {
    return pData->pHeader;
  }
  local_48 = (long)*piVar1;
  local_4c = 0;
  local_50 = 0;
  if (local_48 != 0) {
    local_40 = pLength;
    iVar2 = strcmpAfterPrefix(tocEntryName,(char *)((ulong)(uint)piVar1[1] + (long)piVar1),&local_4c
                             );
    lVar6 = local_48;
    if (iVar2 == 0) {
      uVar7 = 0;
LAB_002f186b:
      uVar4 = (ulong)uVar7;
      if ((int)(uVar7 + 1) < (int)lVar6) {
        iVar10 = piVar1[uVar4 * 2 + 4] - piVar1[uVar4 * 2 + 2];
      }
      else {
        iVar10 = -1;
      }
      *local_40 = iVar10;
      return (DataHeader *)((ulong)(uint)piVar1[uVar4 * 2 + 2] + (long)piVar1);
    }
    iVar10 = (int)local_48;
    uVar7 = iVar10 - 1;
    local_38 = tocEntryName;
    iVar2 = strcmpAfterPrefix(tocEntryName,
                              (char *)((ulong)(uint)piVar1[local_48 * 2 + -1] + (long)piVar1),
                              &local_50);
    if (iVar2 == 0) {
      if (0 < iVar10) goto LAB_002f186b;
    }
    else {
      iVar10 = 1;
      iVar9 = local_4c;
      iVar2 = local_50;
      while (uVar8 = uVar7, iVar5 = iVar2, iVar10 < (int)uVar8) {
        uVar7 = iVar10 + uVar8 >> 1;
        local_54 = iVar5;
        if (iVar9 < iVar5) {
          local_54 = iVar9;
        }
        iVar3 = strcmpAfterPrefix(local_38,(char *)((ulong)(uint)piVar1[(ulong)uVar7 * 2 + 1] +
                                                   (long)piVar1),&local_54);
        iVar2 = local_54;
        if (-1 < iVar3) {
          lVar6 = local_48;
          if (iVar3 == 0) goto LAB_002f186b;
          iVar10 = uVar7 + 1;
          iVar9 = local_54;
          iVar2 = iVar5;
          uVar7 = uVar8;
        }
      }
    }
  }
  return (DataHeader *)0x0;
}

Assistant:

static const DataHeader * U_CALLCONV
offsetTOCLookupFn(const UDataMemory *pData,
                  const char *tocEntryName,
                  int32_t *pLength,
                  UErrorCode *pErrorCode) {
    (void)pErrorCode;
    const UDataOffsetTOC  *toc = (UDataOffsetTOC *)pData->toc;
    if(toc!=NULL) {
        const char *base=(const char *)toc;
        int32_t number, count=(int32_t)toc->count;

        /* perform a binary search for the data in the common data's table of contents */
#if defined (UDATA_DEBUG_DUMP)
        /* list the contents of the TOC each time .. not recommended */
        for(number=0; number<count; ++number) {
            fprintf(stderr, "\tx%d: %s\n", number, &base[toc->entry[number].nameOffset]);
        }
#endif
        number=offsetTOCPrefixBinarySearch(tocEntryName, base, toc->entry, count);
        if(number>=0) {
            /* found it */
            const UDataOffsetTOCEntry *entry=toc->entry+number;
#ifdef UDATA_DEBUG
            fprintf(stderr, "%s: Found.\n", tocEntryName);
#endif
            if((number+1) < count) {
                *pLength = (int32_t)(entry[1].dataOffset - entry->dataOffset);
            } else {
                *pLength = -1;
            }
            return (const DataHeader *)(base+entry->dataOffset);
        } else {
#ifdef UDATA_DEBUG
            fprintf(stderr, "%s: Not found.\n", tocEntryName);
#endif
            return NULL;
        }
    } else {
#ifdef UDATA_DEBUG
        fprintf(stderr, "returning header\n");
#endif

        return pData->pHeader;
    }
}